

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O1

vector<S2LatLng,_std::allocator<S2LatLng>_> * __thiscall
s2textformat::ParseLatLngsOrDie
          (vector<S2LatLng,_std::allocator<S2LatLng>_> *__return_storage_ptr__,s2textformat *this,
          string_view str)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  string_view piece;
  string_view str_00;
  S2LogMessage SStack_38;
  
  piece.ptr_ = str.ptr_;
  (__return_storage_ptr__->super__Vector_base<S2LatLng,_std::allocator<S2LatLng>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<S2LatLng,_std::allocator<S2LatLng>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<S2LatLng,_std::allocator<S2LatLng>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  str_00.length_ = (size_type)piece.ptr_;
  str_00.ptr_ = (char *)this;
  bVar1 = ParseLatLngs(str_00,__return_storage_ptr__);
  if (!bVar1) {
    sVar3 = 3;
    S2LogMessage::S2LogMessage
              (&SStack_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
               ,0x3e,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_38.stream_,"Check failed: ParseLatLngs(str, &latlngs) ",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>(SStack_38.stream_,": str == \"",10);
    piece.length_ = sVar3;
    poVar2 = absl::operator<<((absl *)SStack_38.stream_,(ostream *)this,piece);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
    if (!bVar1) {
      abort();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<S2LatLng> ParseLatLngsOrDie(string_view str) {
  vector<S2LatLng> latlngs;
  S2_CHECK(ParseLatLngs(str, &latlngs)) << ": str == \"" << str << "\"";
  return latlngs;
}